

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O0

void __thiscall
FIX::MessageCracker::crack
          (MessageCracker *this,Message *message,SessionID *sessionID,ApplVerID *applVerID)

{
  bool bVar1;
  ApplVerID *applVerID_local;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  bVar1 = operator==(&applVerID->super_StringField,"2");
  if (bVar1) {
    FIX40::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = operator==(&applVerID->super_StringField,"3");
  if (bVar1) {
    FIX41::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = operator==(&applVerID->super_StringField,"4");
  if (bVar1) {
    FIX42::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = operator==(&applVerID->super_StringField,"5");
  if (bVar1) {
    FIX43::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = operator==(&applVerID->super_StringField,"6");
  if (bVar1) {
    FIX44::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = operator==(&applVerID->super_StringField,"7");
  if (bVar1) {
    FIX50::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = operator==(&applVerID->super_StringField,"8");
  if (bVar1) {
    FIX50SP1::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  bVar1 = operator==(&applVerID->super_StringField,"9");
  if (bVar1) {
    FIX50SP2::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  return;
}

Assistant:

void crack(const Message &message, const SessionID &sessionID, const ApplVerID &applVerID) {
    if (applVerID == ApplVerID_FIX40) {
      ((FIX40::MessageCracker &)(*this)).crack((const FIX40::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX41) {
      ((FIX41::MessageCracker &)(*this)).crack((const FIX41::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX42) {
      ((FIX42::MessageCracker &)(*this)).crack((const FIX42::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX43) {
      ((FIX43::MessageCracker &)(*this)).crack((const FIX43::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX44) {
      ((FIX44::MessageCracker &)(*this)).crack((const FIX44::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50) {
      ((FIX50::MessageCracker &)(*this)).crack((const FIX50::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50_SP1) {
      ((FIX50SP1::MessageCracker &)(*this)).crack((const FIX50SP1::Message &)message, sessionID);
    }
    if (applVerID == ApplVerID_FIX50_SP2) {
      ((FIX50SP2::MessageCracker &)(*this)).crack((const FIX50SP2::Message &)message, sessionID);
    }
  }